

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# consolelog.hpp
# Opt level: O0

void __thiscall
github111116::ConsoleLogger::info<char[33],std::__cxx11::string>
          (ConsoleLogger *this,char (*args) [33],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_local_1;
  char (*args_local) [33];
  ConsoleLogger *this_local;
  
  if (this->loglevel < 2) {
    std::mutex::lock(&this->mtx);
    if ((this->colored & 1U) != 0) {
      std::operator<<(this->out,(string *)&this->infoColor);
    }
    std::operator<<(this->out,"[i] ");
    if ((this->colored & 1U) != 0) {
      std::operator<<(this->out,"\x1b[0m");
    }
    print<char[33],std::__cxx11::string>(this,args,args_1);
    std::mutex::unlock(&this->mtx);
  }
  return;
}

Assistant:

void ConsoleLogger::info(const Args&... args)
{
	if (loglevel > 1) return;
	mtx.lock();
	if (colored) out << infoColor;
	out << "[i] ";
	if (colored) out << "\033[0m";
	print(args...);
	mtx.unlock();
}